

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

void strunescape(char *s)

{
  wchar_t wVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  byte *pbVar5;
  char hex [3];
  byte local_2b;
  byte local_2a;
  undefined1 local_29;
  
  bVar4 = *s;
  if (bVar4 == 0) {
LAB_001fad06:
    *s = 0;
    return;
  }
  bVar3 = false;
  pbVar2 = (byte *)s;
LAB_001fabc9:
  do {
    pbVar5 = pbVar2 + 1;
    if (bVar3) {
      switch(bVar4) {
      case 0x5c:
        *s = 0x5c;
        break;
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 99:
      case 100:
switchD_001fac02_caseD_6f:
        *s = 0x5c;
        ((byte *)s)[1] = *pbVar2;
        s = (char *)((byte *)s + 2);
        goto LAB_001fac68;
      case 0x61:
        *s = 7;
        break;
      case 0x62:
        *s = 8;
        break;
      case 0x65:
        *s = 0x1b;
        break;
      case 0x66:
        *s = 0xc;
        break;
      default:
        switch(bVar4) {
        case 0x6e:
          *s = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x75:
        case 0x77:
          goto switchD_001fac02_caseD_6f;
        case 0x72:
          *s = 0xd;
          break;
        case 0x74:
          *s = 9;
          break;
        case 0x76:
          *s = 0xb;
          break;
        case 0x78:
          local_2b = *pbVar5;
          if (local_2b == 0) {
            ((byte *)s)[0] = 0x5c;
            ((byte *)s)[1] = 0x78;
            s = (char *)((byte *)s + 2);
LAB_001facee:
            bVar3 = true;
            pbVar2 = pbVar5;
          }
          else {
            local_2a = pbVar2[2];
            pbVar5 = pbVar2 + 2;
            if (local_2a == 0) {
              ((byte *)s)[0] = 0x5c;
              ((byte *)s)[1] = 0x78;
              ((byte *)s)[2] = local_2b;
              s = (char *)((byte *)s + 3);
              goto LAB_001facee;
            }
            local_29 = 0;
            wVar1 = hex_str_to_int((char *)&local_2b);
            if (wVar1 == L'\xffffffff') {
              ((byte *)s)[0] = 0x5c;
              ((byte *)s)[1] = 0x78;
              ((byte *)s)[2] = local_2b;
              ((byte *)s)[3] = local_2a;
              s = (char *)((byte *)s + 4);
            }
            *s = (byte)wVar1;
            s = (char *)((byte *)s + 1);
            bVar3 = false;
            pbVar2 = pbVar5;
          }
          if (bVar3) {
            bVar3 = false;
            goto LAB_001fac70;
          }
          goto LAB_001fac68;
        default:
          if (bVar4 != 0x30) goto switchD_001fac02_caseD_6f;
          *s = 0;
        }
      }
      s = (char *)((byte *)s + 1);
LAB_001fac68:
      pbVar2 = pbVar2 + 1;
      bVar3 = false;
    }
    else {
      pbVar2 = pbVar5;
      if (bVar4 == 0x5c) goto code_r0x001fabd3;
      *s = bVar4;
      s = (char *)((byte *)s + 1);
    }
LAB_001fac70:
    bVar4 = *pbVar2;
  } while (bVar4 != 0);
  goto LAB_001fad06;
code_r0x001fabd3:
  bVar4 = *pbVar5;
  bVar3 = true;
  if (bVar4 == 0) goto LAB_001fad06;
  goto LAB_001fabc9;
}

Assistant:

void strunescape(char *s) {
	char *in = s;
	char *out = s;
	bool unescapenext = false;

	while (*in) {
		if (unescapenext) {
			unescapenext = false;

			switch (*in) {
			case '0':
				*out++ = '\0';
				break;
			case 'a':
				*out++ = '\a';
				break;
			case 'b':
				*out++ = '\b';
				break;
			case 't':
				*out++ = '\t';
				break;
			case 'n':
				*out++ = '\n';
				break;
			case 'v':
				*out++ = '\v';
				break;
			case 'f':
				*out++ = '\f';
				break;
			case 'r':
				*out++ = '\r';
				break;
			case '\\':
				*out++ = '\\';
				break;
			case 'e':
				*out++ = '\x1B';
				break;
			case 'x': {
				char hex[3];
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					continue;
				}
				hex[0] = *in;
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					continue;
				}
				hex[1] = *in;
				hex[2] = 0;
				int result = hex_str_to_int(hex);
				if (result == -1) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					*out++ = hex[1];
				}
				*out++ = result;
				break;
				}
			default:
				/* Add back the unmodified sequence */
				*out++ = '\\';
				*out++ = *in;
				break;
			}

			in++;
			continue;
		}

		if (*in == '\\') {
			unescapenext = true;
			in++;
			continue;
		}

		*out++ = *in++;
	}

	*out = 0;
}